

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O0

void __thiscall icu_63::RBBIRuleScanner::~RBBIRuleScanner(RBBIRuleScanner *this)

{
  RBBINode *this_00;
  void *in_RSI;
  UnicodeSet *local_30;
  RBBIRuleScanner *this_local;
  
  this->_vptr_RBBIRuleScanner = (_func_int **)&PTR__RBBIRuleScanner_004b0ce8;
  if (this->fSymbolTable != (RBBISymbolTable *)0x0) {
    (*(this->fSymbolTable->super_SymbolTable)._vptr_SymbolTable[1])();
  }
  if (this->fSetTable != (UHashtable *)0x0) {
    uhash_close_63(this->fSetTable);
    this->fSetTable = (UHashtable *)0x0;
  }
  while (0 < this->fNodeStackPtr) {
    this_00 = this->fNodeStack[this->fNodeStackPtr];
    if (this_00 != (RBBINode *)0x0) {
      RBBINode::~RBBINode(this_00);
      UMemory::operator_delete((UMemory *)this_00,in_RSI);
    }
    this->fNodeStackPtr = this->fNodeStackPtr + -1;
  }
  local_30 = (UnicodeSet *)&this->fRuleNum;
  do {
    local_30 = local_30 + -1;
    UnicodeSet::~UnicodeSet(local_30);
  } while (local_30 != (UnicodeSet *)&this->field_0x480);
  UnicodeString::~UnicodeString(&this->fVarName);
  return;
}

Assistant:

RBBIRuleScanner::~RBBIRuleScanner() {
    delete fSymbolTable;
    if (fSetTable != NULL) {
         uhash_close(fSetTable);
         fSetTable = NULL;

    }


    // Node Stack.
    //   Normally has one entry, which is the entire parse tree for the rules.
    //   If errors occured, there may be additional subtrees left on the stack.
    while (fNodeStackPtr > 0) {
        delete fNodeStack[fNodeStackPtr];
        fNodeStackPtr--;
    }

}